

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

xmlChar * xmlSchemaWhiteSpaceReplace(xmlChar *value)

{
  xmlChar *pxVar1;
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  xmlChar *cur;
  
  if (value == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  lVar3 = 1;
  while (bVar4 = value[lVar3 + -1], 1 < bVar4 - 9) {
    if (bVar4 == 0) goto LAB_001ad59a;
    if (bVar4 == 0xd) break;
    lVar3 = lVar3 + 1;
  }
  pxVar1 = xmlStrdup(value);
  if (pxVar1 == (xmlChar *)0x0) {
LAB_001ad59a:
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pbVar2 = pxVar1 + lVar3;
    bVar4 = pxVar1[lVar3 + -1];
    do {
      if ((bVar4 < 0xe) && ((0x2600U >> (bVar4 & 0x1f) & 1) != 0)) {
        pbVar2[-1] = 0x20;
      }
      bVar4 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar4 != 0);
  }
  return pxVar1;
}

Assistant:

xmlChar *
xmlSchemaWhiteSpaceReplace(const xmlChar *value) {
    const xmlChar *cur = value;
    xmlChar *ret = NULL, *mcur;

    if (value == NULL)
	return(NULL);

    while ((*cur != 0) &&
	(((*cur) != 0xd) && ((*cur) != 0x9) && ((*cur) != 0xa))) {
	cur++;
    }
    if (*cur == 0)
	return (NULL);
    ret = xmlStrdup(value);
    if (ret == NULL)
        return(NULL);
    /* TODO FIXME: I guess gcc will bark at this. */
    mcur = (xmlChar *)  (ret + (cur - value));
    do {
	if ( ((*mcur) == 0xd) || ((*mcur) == 0x9) || ((*mcur) == 0xa) )
	    *mcur = ' ';
	mcur++;
    } while (*mcur != 0);
    return(ret);
}